

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O2

Error __thiscall asmjit::VMemMgr::release(VMemMgr *this,void *p)

{
  uint8_t *puVar1;
  size_t sVar2;
  uint8_t *puVar3;
  MemNode *pMVar4;
  RbNode *pRVar5;
  MemNode *pMVar6;
  size_t sVar7;
  MemNode *pMVar8;
  ulong uVar9;
  ulong uVar10;
  size_t *psVar11;
  MemNode *pMVar12;
  long lVar13;
  MemNode *pMVar14;
  MemNode *pMVar15;
  Error EVar16;
  size_t *psVar17;
  MemNode *__ptr;
  MemNode **ppMVar18;
  bool bVar19;
  MemNode **ppMVar20;
  size_t sVar21;
  byte bVar22;
  RbNode *save_1;
  ulong uVar23;
  RbNode *pRVar24;
  RbNode *save;
  MemNode *pMVar25;
  RbNode *pRVar26;
  bool bVar27;
  bool bVar28;
  RbNode local_58;
  
  if (p == (void *)0x0) {
    return 0;
  }
  pthread_mutex_lock((pthread_mutex_t *)this);
  pMVar8 = vMemMgrFindNodeByPtr(this,(uint8_t *)p);
  if (pMVar8 != (MemNode *)0x0) {
    puVar1 = (pMVar8->super_RbNode).mem;
    lVar13 = 0;
    uVar9 = (ulong)((long)p - (long)puVar1) / pMVar8->density;
    uVar10 = uVar9 >> 6;
    psVar17 = pMVar8->baUsed + uVar10;
    psVar11 = pMVar8->baCont + uVar10;
    uVar9 = 1L << (uVar9 & 0x3f);
    do {
      sVar21 = *psVar17;
      sVar2 = *psVar11;
      do {
        uVar23 = sVar2;
        uVar10 = uVar9;
        sVar21 = ~uVar10 & sVar21;
        lVar13 = lVar13 + 1;
        if ((uVar10 & uVar23) == 0) break;
        uVar9 = uVar10 * 2;
        sVar2 = ~uVar10 & uVar23;
      } while (uVar10 * 2 != 0);
      *psVar17 = sVar21;
      *psVar11 = ~uVar10 & uVar23;
      if ((uVar10 & uVar23) == 0) goto LAB_001554ee;
      psVar17 = psVar17 + 1;
      psVar11 = psVar11 + 1;
      uVar9 = 1;
    } while( true );
  }
  EVar16 = 3;
  goto LAB_001557ca;
LAB_001554ee:
  sVar21 = pMVar8->size;
  sVar2 = pMVar8->used;
  if (sVar2 == sVar21) {
    pMVar15 = this->_optimal;
    do {
      pMVar15 = pMVar15->prev;
      if (pMVar15 == pMVar8) {
        this->_optimal = pMVar8;
        break;
      }
    } while (pMVar15 != (MemNode *)0x0);
  }
  uVar9 = lVar13 * pMVar8->density;
  if (pMVar8->largestBlock < uVar9) {
    pMVar8->largestBlock = uVar9;
  }
  pMVar8->used = sVar2 - uVar9;
  this->_usedBytes = this->_usedBytes - uVar9;
  if (sVar2 == uVar9) {
    OSUtils::releaseVirtualMemory(puVar1,sVar21);
    free(pMVar8->baUsed);
    pMVar8->baUsed = (size_t *)0x0;
    pMVar8->baCont = (size_t *)0x0;
    this->_allocatedBytes = this->_allocatedBytes - pMVar8->size;
    local_58 = (RbNode)(ZEXT832(this->_root) << 0x40);
    pMVar12 = (MemNode *)0x0;
    pMVar15 = (MemNode *)&stack0xffffffffffffffa8;
    __ptr = (MemNode *)0x0;
    bVar27 = true;
LAB_00155585:
    bVar19 = bVar27;
    pMVar25 = __ptr;
    __ptr = pMVar15;
    pMVar15 = (MemNode *)(__ptr->super_RbNode).node[bVar19];
    if (pMVar15 != (MemNode *)0x0) {
      puVar1 = (pMVar15->super_RbNode).mem;
      puVar3 = (pMVar8->super_RbNode).mem;
      bVar27 = puVar1 < puVar3;
      if (pMVar15 == pMVar8) {
        pMVar12 = pMVar15;
      }
      if ((pMVar15->super_RbNode).red == 0) {
        bVar28 = puVar1 < puVar3;
        pRVar24 = (pMVar15->super_RbNode).node[bVar28];
        if ((pRVar24 == (RbNode *)0x0) || (pRVar24->red == 0)) {
          pMVar4 = (MemNode *)(pMVar15->super_RbNode).node[puVar3 <= puVar1];
          if ((pMVar4 != (MemNode *)0x0) && ((pMVar4->super_RbNode).red != 0)) {
            (pMVar15->super_RbNode).node[puVar3 <= puVar1] = (pMVar4->super_RbNode).node[bVar28];
            (pMVar4->super_RbNode).node[bVar28] = (RbNode *)pMVar15;
            (pMVar15->super_RbNode).red = 1;
            (pMVar4->super_RbNode).red = 0;
            (__ptr->super_RbNode).node[bVar19] = (RbNode *)pMVar4;
            __ptr = pMVar4;
            goto LAB_00155585;
          }
          bVar22 = bVar19 ^ 1;
          pRVar24 = (__ptr->super_RbNode).node[bVar22];
          if (pRVar24 != (RbNode *)0x0) {
            if ((pRVar24->node[bVar22] == (RbNode *)0x0) || (pRVar24->node[bVar22]->red == 0)) {
              pRVar26 = pRVar24->node[bVar19];
              if ((pRVar26 == (RbNode *)0x0) || (pRVar26->red == 0)) {
                (__ptr->super_RbNode).red = 0;
                pRVar24->red = 1;
                (pMVar15->super_RbNode).red = 1;
                goto LAB_00155585;
              }
              uVar9 = (ulong)((MemNode *)(pMVar25->super_RbNode).node[1] == __ptr);
LAB_00155682:
              pRVar24->node[bVar19] = pRVar26->node[bVar22];
              pRVar26->node[bVar22] = pRVar24;
              pRVar24->red = 1;
              (__ptr->super_RbNode).node[bVar22] = pRVar26;
              (__ptr->super_RbNode).node[bVar22] = pRVar26->node[bVar19];
              pRVar26->node[bVar19] = &__ptr->super_RbNode;
              (__ptr->super_RbNode).red = 1;
              pRVar24 = pRVar26;
            }
            else {
              pRVar26 = pRVar24->node[bVar19];
              uVar9 = (ulong)((MemNode *)(pMVar25->super_RbNode).node[1] == __ptr);
              if ((pRVar26 != (RbNode *)0x0) && (pRVar26->red != 0)) goto LAB_00155682;
              (__ptr->super_RbNode).node[bVar22] = pRVar26;
              pRVar24->node[bVar19] = &__ptr->super_RbNode;
              (__ptr->super_RbNode).red = 1;
            }
            pRVar24->red = 0;
            (pMVar25->super_RbNode).node[uVar9] = pRVar24;
            pRVar26 = pRVar24->node[0];
            pRVar5 = pRVar24->node[1];
            pRVar24->red = 1;
            (pMVar15->super_RbNode).red = 1;
            pRVar26->red = 0;
            pRVar5->red = 0;
          }
        }
      }
      goto LAB_00155585;
    }
    if (pMVar12 == (MemNode *)0x0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/vmem.cpp"
                 ,0x1cb,"f != nullptr");
    }
    if (pMVar12 == (MemNode *)&stack0xffffffffffffffa8) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/vmem.cpp"
                 ,0x1cc,"f != &head");
    }
    if (__ptr == (MemNode *)&stack0xffffffffffffffa8) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/vmem.cpp"
                 ,0x1cd,"q != &head");
    }
    if (pMVar12 != __ptr) {
      (pMVar12->super_RbNode).mem = (__ptr->super_RbNode).mem;
      sVar21 = __ptr->used;
      sVar2 = __ptr->blocks;
      sVar7 = __ptr->density;
      pMVar12->size = __ptr->size;
      pMVar12->used = sVar21;
      pMVar12->blocks = sVar2;
      pMVar12->density = sVar7;
      pMVar12->largestBlock = __ptr->largestBlock;
      psVar11 = __ptr->baCont;
      pMVar12->baUsed = __ptr->baUsed;
      pMVar12->baCont = psVar11;
    }
    (pMVar25->super_RbNode).node[(MemNode *)(pMVar25->super_RbNode).node[1] == __ptr] =
         (__ptr->super_RbNode).node[(__ptr->super_RbNode).node[0] == (RbNode *)0x0];
    this->_root = (MemNode *)local_58.node[1];
    if ((MemNode *)local_58.node[1] != (MemNode *)0x0) {
      (((MemNode *)local_58.node[1])->super_RbNode).red = 0;
    }
    pMVar6 = __ptr->prev;
    pMVar14 = __ptr->next;
    ppMVar18 = &pMVar6->next;
    if (pMVar6 == (MemNode *)0x0) {
      ppMVar18 = &this->_first;
    }
    ppMVar20 = &pMVar14->prev;
    if (pMVar14 == (MemNode *)0x0) {
      ppMVar20 = &this->_last;
    }
    *ppMVar18 = pMVar14;
    *ppMVar20 = pMVar6;
    if (this->_optimal == __ptr) {
      if (pMVar6 != (MemNode *)0x0) {
        pMVar14 = pMVar6;
      }
      this->_optimal = pMVar14;
    }
    free(__ptr);
    bVar27 = vMemMgrCheckTree(this);
    if (!bVar27) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/vmem.cpp"
                 ,0x358,"vMemMgrCheckTree(this)");
    }
  }
  EVar16 = 0;
LAB_001557ca:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return EVar16;
}

Assistant:

Error VMemMgr::release(void* p) noexcept {
  if (!p) return kErrorOk;

  AutoLock locked(_lock);
  MemNode* node = vMemMgrFindNodeByPtr(this, static_cast<uint8_t*>(p));
  if (!node) return DebugUtils::errored(kErrorInvalidArgument);

  size_t offset = (size_t)((uint8_t*)p - (uint8_t*)node->mem);
  size_t bitpos = M_DIV(offset, node->density);
  size_t i = (bitpos / kBitsPerEntity);

  size_t* up = node->baUsed + i;  // Current ubits address.
  size_t* cp = node->baCont + i;  // Current cbits address.
  size_t ubits = *up;             // Current ubits[0] value.
  size_t cbits = *cp;             // Current cbits[0] value.
  size_t bit = (size_t)1 << (bitpos % kBitsPerEntity);

  size_t cont = 0;
  bool stop;

  for (;;) {
    stop = (cbits & bit) == 0;
    ubits &= ~bit;
    cbits &= ~bit;

    bit <<= 1;
    cont++;

    if (stop || bit == 0) {
      *up = ubits;
      *cp = cbits;
      if (stop)
        break;

      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // If the freed block is fully allocated node then it's needed to
  // update 'optimal' pointer in memory manager.
  if (node->used == node->size) {
    MemNode* cur = _optimal;

    do {
      cur = cur->prev;
      if (cur == node) {
        _optimal = node;
        break;
      }
    } while (cur);
  }

  // Statistics.
  cont *= node->density;
  if (node->largestBlock < cont)
    node->largestBlock = cont;

  node->used -= cont;
  _usedBytes -= cont;

  // If page is empty, we can free it.
  if (node->used == 0) {
    // Free memory associated with node (this memory is not accessed
    // anymore so it's safe).
    vMemMgrReleaseVMem(this, node->mem, node->size);
    Internal::releaseMemory(node->baUsed);

    node->baUsed = nullptr;
    node->baCont = nullptr;

    // Statistics.
    _allocatedBytes -= node->size;

    // Remove node. This function can return different node than
    // passed into, but data is copied into previous node if needed.
    Internal::releaseMemory(vMemMgrRemoveNode(this, node));
    ASMJIT_ASSERT(vMemMgrCheckTree(this));
  }

  return kErrorOk;
}